

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O0

void test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>
               (void)

{
  allocator<unsigned_int> *this;
  initializer_list<unsigned_int> __l;
  initializer_list<unsigned_int> __l_00;
  initializer_list<unsigned_int> __l_01;
  initializer_list<unsigned_int> __l_02;
  initializer_list<unsigned_int> __l_03;
  initializer_list<unsigned_int> __l_04;
  initializer_list<unsigned_int> __l_05;
  initializer_list<unsigned_int> __l_06;
  initializer_list<unsigned_int> __l_07;
  initializer_list<unsigned_int> __l_08;
  initializer_list<unsigned_int> __l_09;
  initializer_list<unsigned_int> __l_10;
  initializer_list<unsigned_int> __l_11;
  initializer_list<unsigned_int> __l_12;
  initializer_list<unsigned_int> __l_13;
  initializer_list<unsigned_int> __l_14;
  initializer_list<unsigned_int> __l_15;
  undefined8 uVar1;
  bool bVar2;
  pointer __args;
  pointer pPVar3;
  pointer pPVar4;
  reference pPVar5;
  int *__args_00;
  uint *__args_1;
  uint *__args_2;
  type_conflict1 *__args_1_00;
  type_conflict1 *__args_2_00;
  type_conflict *__args_01;
  lazy_ostream *plVar6;
  reference ptVar7;
  __tuple_element_t<0UL,_tuple<int,_int,_int>_> *p_Var8;
  __tuple_element_t<1UL,_tuple<int,_int,_int>_> *p_Var9;
  __tuple_element_t<2UL,_tuple<int,_int,_int>_> *p_Var10;
  pair<std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>,_bool> pVar11;
  basic_cstring<const_char> local_1500;
  basic_cstring<const_char> local_14f0;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_14e0;
  assertion_result local_14c0;
  basic_cstring<const_char> local_14a8;
  basic_cstring<const_char> local_1498;
  basic_cstring<const_char> local_1488;
  basic_cstring<const_char> local_1478;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_1468;
  assertion_result local_1448;
  basic_cstring<const_char> local_1430;
  basic_cstring<const_char> local_1420;
  basic_cstring<const_char> local_1410;
  basic_cstring<const_char> local_1400;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
  local_13f0;
  _Self local_13d0;
  assertion_result local_13c8;
  basic_cstring<const_char> local_13b0;
  basic_cstring<const_char> local_13a0;
  undefined4 local_138c;
  basic_cstring<const_char> local_1388;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1378;
  basic_cstring<const_char> local_1350;
  basic_cstring<const_char> local_1340;
  undefined4 local_132c;
  basic_cstring<const_char> local_1328;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1318;
  basic_cstring<const_char> local_12f0;
  basic_cstring<const_char> local_12e0;
  undefined4 local_12cc;
  basic_cstring<const_char> local_12c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_12b8;
  basic_cstring<const_char> local_1290;
  basic_cstring<const_char> local_1280;
  undefined4 local_126c;
  basic_cstring<const_char> local_1268;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1258;
  basic_cstring<const_char> local_1230;
  basic_cstring<const_char> local_1220;
  undefined4 local_120c;
  basic_cstring<const_char> local_1208;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_11f8;
  basic_cstring<const_char> local_11d0;
  basic_cstring<const_char> local_11c0;
  undefined4 local_11ac;
  basic_cstring<const_char> local_11a8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1198;
  basic_cstring<const_char> local_1170;
  basic_cstring<const_char> local_1160;
  undefined4 local_114c;
  basic_cstring<const_char> local_1148;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1138;
  basic_cstring<const_char> local_1110;
  basic_cstring<const_char> local_1100;
  undefined4 local_10ec;
  basic_cstring<const_char> local_10e8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_10d8;
  basic_cstring<const_char> local_10b0;
  basic_cstring<const_char> local_10a0;
  undefined4 local_108c;
  basic_cstring<const_char> local_1088;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1078;
  basic_cstring<const_char> local_1050;
  basic_cstring<const_char> local_1040;
  undefined4 local_102c;
  basic_cstring<const_char> local_1028;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_1018;
  basic_cstring<const_char> local_ff0;
  basic_cstring<const_char> local_fe0;
  undefined4 local_fcc;
  basic_cstring<const_char> local_fc8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_fb8;
  basic_cstring<const_char> local_f90;
  basic_cstring<const_char> local_f80;
  undefined4 local_f6c;
  basic_cstring<const_char> local_f68;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_f58;
  basic_cstring<const_char> local_f30;
  basic_cstring<const_char> local_f20;
  undefined4 local_f0c;
  basic_cstring<const_char> local_f08;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_ef8;
  basic_cstring<const_char> local_ed0;
  basic_cstring<const_char> local_ec0;
  undefined4 local_eac;
  basic_cstring<const_char> local_ea8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_e98;
  basic_cstring<const_char> local_e70;
  basic_cstring<const_char> local_e60;
  undefined4 local_e4c;
  basic_cstring<const_char> local_e48;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_e38;
  basic_cstring<const_char> local_e10;
  basic_cstring<const_char> local_e00;
  undefined4 local_dec;
  basic_cstring<const_char> local_de8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_dd8;
  basic_cstring<const_char> local_db0;
  basic_cstring<const_char> local_da0;
  undefined4 local_d8c;
  basic_cstring<const_char> local_d88;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_d78;
  basic_cstring<const_char> local_d50;
  basic_cstring<const_char> local_d40;
  undefined4 local_d2c;
  basic_cstring<const_char> local_d28;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_d18;
  basic_cstring<const_char> local_cf0;
  basic_cstring<const_char> local_ce0;
  undefined4 local_ccc;
  basic_cstring<const_char> local_cc8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_cb8;
  basic_cstring<const_char> local_c90;
  basic_cstring<const_char> local_c80;
  undefined4 local_c6c;
  basic_cstring<const_char> local_c68;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_c58;
  basic_cstring<const_char> local_c30;
  basic_cstring<const_char> local_c20;
  undefined4 local_c0c;
  basic_cstring<const_char> local_c08;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_bf8;
  basic_cstring<const_char> local_bd0;
  basic_cstring<const_char> local_bc0;
  undefined4 local_bac;
  basic_cstring<const_char> local_ba8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_b98;
  basic_cstring<const_char> local_b70;
  basic_cstring<const_char> local_b60;
  undefined4 local_b4c;
  basic_cstring<const_char> local_b48;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_b38;
  basic_cstring<const_char> local_b10;
  basic_cstring<const_char> local_b00;
  undefined4 local_aec;
  basic_cstring<const_char> local_ae8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_ad8;
  basic_cstring<const_char> local_ab0;
  basic_cstring<const_char> local_aa0;
  undefined4 local_a8c;
  basic_cstring<const_char> local_a88;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_a78;
  basic_cstring<const_char> local_a50;
  basic_cstring<const_char> local_a40;
  undefined4 local_a2c;
  basic_cstring<const_char> local_a28;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_a18;
  basic_cstring<const_char> local_9f0;
  basic_cstring<const_char> local_9e0;
  undefined4 local_9cc;
  basic_cstring<const_char> local_9c8;
  lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> local_9b8;
  basic_cstring<const_char> local_990;
  basic_cstring<const_char> local_980;
  _Rb_tree_const_iterator<std::tuple<int,_int,_int>_> local_970;
  iterator it;
  type *z;
  type *y;
  type *x;
  uint local_938;
  _Base_ptr local_930;
  undefined1 local_928;
  _Base_ptr local_920;
  undefined1 local_918;
  _Self local_910;
  _Self local_908;
  const_iterator it_1;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars3;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars2;
  set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> bars1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_858;
  allocator<unsigned_int> local_83d;
  uint local_83c;
  iterator local_838;
  size_type local_830;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_828;
  allocator<unsigned_int> local_809;
  uint local_808 [6];
  iterator local_7f0;
  size_type local_7e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_7e0;
  allocator<unsigned_int> local_7c5;
  uint local_7c4 [3];
  iterator local_7b8;
  size_type local_7b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_7a8;
  allocator<unsigned_int> local_789;
  uint local_788 [4];
  iterator local_778;
  size_type local_770;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_768;
  allocator<unsigned_int> local_74d;
  uint local_74c [3];
  iterator local_740;
  size_type local_738;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_730;
  allocator<unsigned_int> local_711;
  uint local_710 [4];
  iterator local_700;
  size_type local_6f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_6f0;
  allocator<unsigned_int> local_6d5;
  uint local_6d4 [3];
  iterator local_6c8;
  size_type local_6c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_6b8;
  allocator<unsigned_int> local_699;
  uint local_698 [2];
  iterator local_690;
  size_type local_688;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_680;
  allocator<unsigned_int> local_665;
  uint local_664;
  iterator local_660;
  size_type local_658;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_650;
  allocator<unsigned_int> local_631;
  uint local_630 [2];
  iterator local_628;
  size_type local_620;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_618;
  allocator<unsigned_int> local_5f9;
  uint local_5f8 [2];
  iterator local_5f0;
  size_type local_5e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_5e0;
  allocator<unsigned_int> local_5c1;
  uint local_5c0 [2];
  iterator local_5b8;
  size_type local_5b0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_5a8;
  allocator<unsigned_int> local_589;
  uint local_588 [2];
  iterator local_580;
  size_type local_578;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_570;
  allocator<unsigned_int> local_551;
  uint local_550 [2];
  iterator local_548;
  size_type local_540;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_538;
  allocator<unsigned_int> local_519;
  uint local_518 [2];
  iterator local_510;
  size_type local_508;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_500;
  allocator<unsigned_int> local_4e5;
  uint local_4e4;
  iterator local_4e0;
  size_type local_4d8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_4d0;
  undefined1 local_4b8 [8];
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  reducedMatrix;
  Barcode *barcode;
  undefined4 local_490;
  undefined4 local_48c;
  initializer_list<unsigned_int> local_488;
  Insertion_return local_478;
  uint local_45c [3];
  initializer_list<unsigned_int> local_450;
  Insertion_return local_440;
  uint local_428 [2];
  initializer_list<unsigned_int> local_420;
  Insertion_return local_410;
  uint local_3f8 [2];
  initializer_list<unsigned_int> local_3f0;
  Insertion_return local_3e0;
  uint local_3c8 [2];
  initializer_list<unsigned_int> local_3c0;
  Insertion_return local_3b0;
  uint local_398 [2];
  initializer_list<unsigned_int> local_390;
  Insertion_return local_380;
  uint local_368 [2];
  initializer_list<unsigned_int> local_360;
  Insertion_return local_350;
  uint local_338 [2];
  initializer_list<unsigned_int> local_330;
  Insertion_return local_320;
  uint local_308 [2];
  initializer_list<unsigned_int> local_300;
  Insertion_return local_2f0;
  uint local_2d8 [2];
  initializer_list<unsigned_int> local_2d0;
  Insertion_return local_2c0;
  initializer_list<unsigned_int> local_2a8;
  Insertion_return local_298;
  initializer_list<unsigned_int> local_280;
  Insertion_return local_270;
  initializer_list<unsigned_int> local_258;
  Insertion_return local_248;
  initializer_list<unsigned_int> local_230;
  Insertion_return local_220;
  initializer_list<unsigned_int> local_208;
  Insertion_return local_1f8;
  initializer_list<unsigned_int> local_1e0;
  Insertion_return local_1d0;
  initializer_list<unsigned_int> local_1a8;
  Insertion_return local_198;
  undefined1 local_180 [8];
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>
  m;
  
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>
  ::Matrix((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>
            *)local_180,0x11,2);
  std::initializer_list<unsigned_int>::initializer_list(&local_1a8);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            (&local_198,
             (Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
              *)local_180,0,&local_1a8,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_198);
  std::initializer_list<unsigned_int>::initializer_list(&local_1e0);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            (&local_1d0,
             (Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
              *)local_180,1,&local_1e0,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1d0);
  std::initializer_list<unsigned_int>::initializer_list(&local_208);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            (&local_1f8,
             (Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
              *)local_180,2,&local_208,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_1f8);
  std::initializer_list<unsigned_int>::initializer_list(&local_230);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            (&local_220,
             (Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
              *)local_180,3,&local_230,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_220);
  std::initializer_list<unsigned_int>::initializer_list(&local_258);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            (&local_248,
             (Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
              *)local_180,4,&local_258,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_248);
  std::initializer_list<unsigned_int>::initializer_list(&local_280);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            (&local_270,
             (Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
              *)local_180,5,&local_280,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_270);
  std::initializer_list<unsigned_int>::initializer_list(&local_2a8);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            (&local_298,
             (Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
              *)local_180,6,&local_2a8,0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_298);
  local_2d8[0] = 0;
  local_2d8[1] = 1;
  local_2d0._M_array = local_2d8;
  local_2d0._M_len = 2;
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            (&local_2c0,
             (Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
              *)local_180,10,&local_2d0,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_2c0);
  local_308[0] = 1;
  local_308[1] = 3;
  local_300._M_array = local_308;
  local_300._M_len = 2;
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            (&local_2f0,
             (Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
              *)local_180,0xb,&local_300,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_2f0);
  local_338[0] = 2;
  local_338[1] = 3;
  local_330._M_array = local_338;
  local_330._M_len = 2;
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            (&local_320,
             (Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
              *)local_180,0xc,&local_330,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_320);
  local_368[0] = 2;
  local_368[1] = 4;
  local_360._M_array = local_368;
  local_360._M_len = 2;
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            (&local_350,
             (Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
              *)local_180,0xd,&local_360,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_350);
  local_398[0] = 3;
  local_398[1] = 4;
  local_390._M_array = local_398;
  local_390._M_len = 2;
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            (&local_380,
             (Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
              *)local_180,0xe,&local_390,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_380);
  local_3c8[0] = 2;
  local_3c8[1] = 6;
  local_3c0._M_array = local_3c8;
  local_3c0._M_len = 2;
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            (&local_3b0,
             (Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
              *)local_180,0xf,&local_3c0,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_3b0);
  local_3f8[0] = 4;
  local_3f8[1] = 6;
  local_3f0._M_array = local_3f8;
  local_3f0._M_len = 2;
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            (&local_3e0,
             (Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
              *)local_180,0x10,&local_3f0,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_3e0);
  local_428[0] = 5;
  local_428[1] = 6;
  local_420._M_array = local_428;
  local_420._M_len = 2;
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            (&local_410,
             (Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
              *)local_180,0x11,&local_420,1);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_410);
  local_45c[0] = 0xc;
  local_45c[1] = 0xd;
  local_45c[2] = 0xe;
  local_450._M_array = local_45c;
  local_450._M_len = 3;
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            (&local_440,
             (Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
              *)local_180,0x1e,&local_450,2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_440);
  barcode._4_4_ = 0xd;
  local_490 = 0xf;
  local_48c = 0x10;
  local_488._M_array = (iterator)((long)&barcode + 4);
  local_488._M_len = 3;
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
  ::insert_boundary<std::initializer_list<unsigned_int>>
            (&local_478,
             (Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
              *)local_180,0x1f,&local_488,2);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_478);
  reducedMatrix.
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)Gudhi::persistence_matrix::
                Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
                ::get_current_barcode_abi_cxx11_
                          ((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>
                            *)local_180);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
            *)local_4b8);
  local_4e4 = 0;
  local_4e0 = &local_4e4;
  local_4d8 = 1;
  std::allocator<unsigned_int>::allocator(&local_4e5);
  __l_15._M_len = local_4d8;
  __l_15._M_array = local_4e0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_4d0,__l_15,&local_4e5);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_4b8,&local_4d0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_4d0);
  std::allocator<unsigned_int>::~allocator(&local_4e5);
  local_518[0] = 0;
  local_518[1] = 1;
  local_510 = local_518;
  local_508 = 2;
  std::allocator<unsigned_int>::allocator(&local_519);
  __l_14._M_len = local_508;
  __l_14._M_array = local_510;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_500,__l_14,&local_519);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_4b8,&local_500);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_500);
  std::allocator<unsigned_int>::~allocator(&local_519);
  local_550[0] = 0;
  local_550[1] = 2;
  local_548 = local_550;
  local_540 = 2;
  std::allocator<unsigned_int>::allocator(&local_551);
  __l_13._M_len = local_540;
  __l_13._M_array = local_548;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_538,__l_13,&local_551);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_4b8,&local_538);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_538);
  std::allocator<unsigned_int>::~allocator(&local_551);
  local_588[0] = 0;
  local_588[1] = 3;
  local_580 = local_588;
  local_578 = 2;
  std::allocator<unsigned_int>::allocator(&local_589);
  __l_12._M_len = local_578;
  __l_12._M_array = local_580;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_570,__l_12,&local_589);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_4b8,&local_570);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_570);
  std::allocator<unsigned_int>::~allocator(&local_589);
  local_5c0[0] = 0;
  local_5c0[1] = 4;
  local_5b8 = local_5c0;
  local_5b0 = 2;
  std::allocator<unsigned_int>::allocator(&local_5c1);
  __l_11._M_len = local_5b0;
  __l_11._M_array = local_5b8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_5a8,__l_11,&local_5c1);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_4b8,&local_5a8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_5a8);
  std::allocator<unsigned_int>::~allocator(&local_5c1);
  local_5f8[0] = 0;
  local_5f8[1] = 5;
  local_5f0 = local_5f8;
  local_5e8 = 2;
  std::allocator<unsigned_int>::allocator(&local_5f9);
  __l_10._M_len = local_5e8;
  __l_10._M_array = local_5f0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_5e0,__l_10,&local_5f9);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_4b8,&local_5e0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_5e0);
  std::allocator<unsigned_int>::~allocator(&local_5f9);
  local_630[0] = 0;
  local_630[1] = 6;
  local_628 = local_630;
  local_620 = 2;
  std::allocator<unsigned_int>::allocator(&local_631);
  __l_09._M_len = local_620;
  __l_09._M_array = local_628;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_618,__l_09,&local_631);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_4b8,&local_618);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_618);
  std::allocator<unsigned_int>::~allocator(&local_631);
  local_664 = 10;
  local_660 = &local_664;
  local_658 = 1;
  std::allocator<unsigned_int>::allocator(&local_665);
  __l_08._M_len = local_658;
  __l_08._M_array = local_660;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_650,__l_08,&local_665);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_4b8,&local_650);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_650);
  std::allocator<unsigned_int>::~allocator(&local_665);
  local_698[0] = 10;
  local_698[1] = 0xb;
  local_690 = local_698;
  local_688 = 2;
  std::allocator<unsigned_int>::allocator(&local_699);
  __l_07._M_len = local_688;
  __l_07._M_array = local_690;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_680,__l_07,&local_699);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_4b8,&local_680);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_680);
  std::allocator<unsigned_int>::~allocator(&local_699);
  local_6d4[0] = 10;
  local_6d4[1] = 0xb;
  local_6d4[2] = 0xc;
  local_6c8 = local_6d4;
  local_6c0 = 3;
  std::allocator<unsigned_int>::allocator(&local_6d5);
  __l_06._M_len = local_6c0;
  __l_06._M_array = local_6c8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_6b8,__l_06,&local_6d5);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_4b8,&local_6b8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_6b8);
  std::allocator<unsigned_int>::~allocator(&local_6d5);
  local_710[0] = 10;
  local_710[1] = 0xb;
  local_710[2] = 0xc;
  local_710[3] = 0xd;
  local_700 = local_710;
  local_6f8 = 4;
  std::allocator<unsigned_int>::allocator(&local_711);
  __l_05._M_len = local_6f8;
  __l_05._M_array = local_700;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_6f0,__l_05,&local_711);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_4b8,&local_6f0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_6f0);
  std::allocator<unsigned_int>::~allocator(&local_711);
  local_74c[0] = 0xc;
  local_74c[1] = 0xd;
  local_74c[2] = 0xe;
  local_740 = local_74c;
  local_738 = 3;
  std::allocator<unsigned_int>::allocator(&local_74d);
  __l_04._M_len = local_738;
  __l_04._M_array = local_740;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_730,__l_04,&local_74d);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_4b8,&local_730);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_730);
  std::allocator<unsigned_int>::~allocator(&local_74d);
  local_788[0] = 10;
  local_788[1] = 0xb;
  local_788[2] = 0xc;
  local_788[3] = 0xf;
  local_778 = local_788;
  local_770 = 4;
  std::allocator<unsigned_int>::allocator(&local_789);
  __l_03._M_len = local_770;
  __l_03._M_array = local_778;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_768,__l_03,&local_789);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_4b8,&local_768);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_768);
  std::allocator<unsigned_int>::~allocator(&local_789);
  local_7c4[0] = 0xd;
  local_7c4[1] = 0xf;
  local_7c4[2] = 0x10;
  local_7b8 = local_7c4;
  local_7b0 = 3;
  std::allocator<unsigned_int>::allocator(&local_7c5);
  __l_02._M_len = local_7b0;
  __l_02._M_array = local_7b8;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_7a8,__l_02,&local_7c5);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_4b8,&local_7a8);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_7a8);
  std::allocator<unsigned_int>::~allocator(&local_7c5);
  local_808[0] = 10;
  local_808[1] = 0xb;
  local_808[2] = 0xc;
  local_808[3] = 0xf;
  local_808[4] = 0x11;
  local_7f0 = local_808;
  local_7e8 = 5;
  std::allocator<unsigned_int>::allocator(&local_809);
  __l_01._M_len = local_7e8;
  __l_01._M_array = local_7f0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_7e0,__l_01,&local_809);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_4b8,&local_7e0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_7e0);
  std::allocator<unsigned_int>::~allocator(&local_809);
  local_83c = 0x1e;
  local_838 = &local_83c;
  local_830 = 1;
  std::allocator<unsigned_int>::allocator(&local_83d);
  __l_00._M_len = local_830;
  __l_00._M_array = local_838;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_828,__l_00,&local_83d);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_4b8,&local_828);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_828);
  std::allocator<unsigned_int>::~allocator(&local_83d);
  bars1._M_t._M_impl.super__Rb_tree_header._M_node_count._4_4_ = 0x1f;
  this = (allocator<unsigned_int> *)
         ((long)&bars1._M_t._M_impl.super__Rb_tree_header._M_node_count + 3);
  std::allocator<unsigned_int>::allocator(this);
  __l._M_len = 1;
  __l._M_array = (iterator)((long)&bars1._M_t._M_impl.super__Rb_tree_header._M_node_count + 4);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_858,__l,this);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_back((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               *)local_4b8,&local_858);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_858);
  std::allocator<unsigned_int>::~allocator
            ((allocator<unsigned_int> *)
             ((long)&bars1._M_t._M_impl.super__Rb_tree_header._M_node_count + 3));
  test_content_equality<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>
            ((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
              *)local_4b8,
             (Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>
              *)local_180);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars3._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&it_1);
  local_908._M_node =
       (_List_node_base *)
       std::__cxx11::
       list<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
       ::begin((list<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                *)reducedMatrix.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    local_910._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
         ::end((list<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                *)reducedMatrix.
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar2 = std::operator!=(&local_908,&local_910);
    if (!bVar2) break;
    __args = std::
             _List_const_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>
             ::operator->(&local_908);
    pPVar3 = std::
             _List_const_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>
             ::operator->(&local_908);
    pPVar4 = std::
             _List_const_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>
             ::operator->(&local_908);
    pVar11 = std::
             set<std::tuple<int,int,int>,test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
             ::emplace<int_const&,unsigned_int_const&,unsigned_int_const&>
                       ((set<std::tuple<int,int,int>,test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                         *)&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count,&__args->dim,
                        &pPVar3->birth,&pPVar4->death);
    local_920 = (_Base_ptr)pVar11.first._M_node;
    local_918 = pVar11.second;
    pPVar5 = std::
             _List_const_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>
             ::operator*(&local_908);
    __args_00 = std::get<2ul,int,unsigned_int>(pPVar5);
    pPVar5 = std::
             _List_const_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>
             ::operator*(&local_908);
    __args_1 = std::get<0ul,int,unsigned_int>(pPVar5);
    pPVar5 = std::
             _List_const_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>
             ::operator*(&local_908);
    __args_2 = std::get<1ul,int,unsigned_int>(pPVar5);
    pVar11 = std::
             set<std::tuple<int,int,int>,test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
             ::emplace<int_const&,unsigned_int_const&,unsigned_int_const&>
                       ((set<std::tuple<int,int,int>,test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                         *)&bars3._M_t._M_impl.super__Rb_tree_header._M_node_count,__args_00,
                        __args_1,__args_2);
    local_930 = (_Base_ptr)pVar11.first._M_node;
    local_928 = pVar11.second;
    pPVar5 = std::
             _List_const_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>
             ::operator*(&local_908);
    local_938 = pPVar5->death;
    x = *(type **)pPVar5;
    __args_1_00 = Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>::get<0ul>
                            ((Persistence_interval<int,unsigned_int> *)&x);
    __args_2_00 = Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>::get<1ul>
                            ((Persistence_interval<int,unsigned_int> *)&x);
    __args_01 = Gudhi::persistence_matrix::Persistence_interval<int,unsigned_int>::get<2ul>
                          ((Persistence_interval<int,unsigned_int> *)&x);
    pVar11 = std::
             set<std::tuple<int,int,int>,test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
             ::emplace<int&,unsigned_int&,unsigned_int&>
                       ((set<std::tuple<int,int,int>,test_shifted_barcode1<Gudhi::persistence_matrix::Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,false,true,true,false,true>>>()::BarComp,std::allocator<std::tuple<int,int,int>>>
                         *)&it_1,__args_01,__args_1_00,__args_2_00);
    it._M_node = (_Base_ptr)pVar11.first._M_node;
    std::_List_const_iterator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>::
    operator++(&local_908);
  }
  local_970._M_node =
       (_Base_ptr)
       std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::
       begin((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_980,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_990);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_980,0x634,&local_990);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_9b8,plVar6,(char (*) [1])0x1de254);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_970);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_9cc = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_9b8,&local_9c8,0x634,1,2,p_Var8,"std::get<0>(*it)",&local_9cc,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_9b8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_9e0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_9f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_9e0,0x635,&local_9f0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_a18,plVar6,(char (*) [1])0x1de254);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a28,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_970);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_a2c = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_a18,&local_a28,0x635,1,2,p_Var9,"std::get<1>(*it)",&local_a2c,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_a18);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a40,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_a50);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_a40,0x636,&local_a50);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_a78,plVar6,(char (*) [1])0x1de254);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_a88,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_970);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_a8c = 0xffffffff;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_a78,&local_a88,0x636,1,2,p_Var10,"std::get<2>(*it)",&local_a8c,"-1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_a78);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_970);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_aa0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_ab0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_aa0,0x638,&local_ab0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_ad8,plVar6,(char (*) [1])0x1de254);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ae8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_970);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_aec = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_ad8,&local_ae8,0x638,1,2,p_Var8,"std::get<0>(*it)",&local_aec,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_ad8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b00,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_b10);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_b00,0x639,&local_b10);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_b38,plVar6,(char (*) [1])0x1de254);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b48,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_970);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_b4c = 1;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_b38,&local_b48,0x639,1,2,p_Var9,"std::get<1>(*it)",&local_b4c,"1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_b38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_b60,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_b70);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_b60,0x63a,&local_b70);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_b98,plVar6,(char (*) [1])0x1de254);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ba8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_970);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_bac = 7;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_b98,&local_ba8,0x63a,1,2,p_Var10,"std::get<2>(*it)",&local_bac,"7");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_b98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_970);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_bc0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_bd0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_bc0,0x63c,&local_bd0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_bf8,plVar6,(char (*) [1])0x1de254);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c08,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_970);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_c0c = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_bf8,&local_c08,0x63c,1,2,p_Var8,"std::get<0>(*it)",&local_c0c,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_bf8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c20,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_c30);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_c20,0x63d,&local_c30);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_c58,plVar6,(char (*) [1])0x1de254);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c68,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_970);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_c6c = 2;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_c58,&local_c68,0x63d,1,2,p_Var9,"std::get<1>(*it)",&local_c6c,"2");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_c58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_c80,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_c90);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_c80,0x63e,&local_c90);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_cb8,plVar6,(char (*) [1])0x1de254);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_cc8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_970);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_ccc = 9;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_cb8,&local_cc8,0x63e,1,2,p_Var10,"std::get<2>(*it)",&local_ccc,"9");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_cb8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_970);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ce0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_cf0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_ce0,0x640,&local_cf0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_d18,plVar6,(char (*) [1])0x1de254);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d28,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_970);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_d2c = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_d18,&local_d28,0x640,1,2,p_Var8,"std::get<0>(*it)",&local_d2c,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_d18);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d40,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_d50);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_d40,0x641,&local_d50);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_d78,plVar6,(char (*) [1])0x1de254);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_d88,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_970);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_d8c = 3;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_d78,&local_d88,0x641,1,2,p_Var9,"std::get<1>(*it)",&local_d8c,"3");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_d78);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_da0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_db0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_da0,0x642,&local_db0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_dd8,plVar6,(char (*) [1])0x1de254);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_de8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_970);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_dec = 8;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_dd8,&local_de8,0x642,1,2,p_Var10,"std::get<2>(*it)",&local_dec,"8");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_dd8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_970);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e00,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e10);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_e00,0x644,&local_e10);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_e38,plVar6,(char (*) [1])0x1de254);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e48,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_970);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_e4c = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_e38,&local_e48,0x644,1,2,p_Var8,"std::get<0>(*it)",&local_e4c,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_e38);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_e60,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_e70);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_e60,0x645,&local_e70);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_e98,plVar6,(char (*) [1])0x1de254);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ea8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_970);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_eac = 4;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_e98,&local_ea8,0x645,1,2,p_Var9,"std::get<1>(*it)",&local_eac,"4");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_e98);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_ec0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_ed0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_ec0,0x646,&local_ed0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_ef8,plVar6,(char (*) [1])0x1de254);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f08,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_970);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_f0c = 10;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_ef8,&local_f08,0x646,1,2,p_Var10,"std::get<2>(*it)",&local_f0c,"10");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_ef8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_970);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f20,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_f30);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_f20,0x648,&local_f30);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_f58,plVar6,(char (*) [1])0x1de254);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f68,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_970);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_f6c = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_f58,&local_f68,0x648,1,2,p_Var8,"std::get<0>(*it)",&local_f6c,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_f58);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f80,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_f90);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_f80,0x649,&local_f90);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_fb8,plVar6,(char (*) [1])0x1de254);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_fc8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_970);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_fcc = 5;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_fb8,&local_fc8,0x649,1,2,p_Var9,"std::get<1>(*it)",&local_fcc,"5");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_fb8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_fe0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_ff0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_fe0,0x64a,&local_ff0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1018,plVar6,(char (*) [1])0x1de254);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1028,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_970);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_102c = 0xe;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_1018,&local_1028,0x64a,1,2,p_Var10,"std::get<2>(*it)",&local_102c,"14");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1018);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_970);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1040,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1050);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1040,0x64c,&local_1050);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1078,plVar6,(char (*) [1])0x1de254);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1088,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_970);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_108c = 0;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_1078,&local_1088,0x64c,1,2,p_Var8,"std::get<0>(*it)",&local_108c,"0");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1078);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_10a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_10b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_10a0,0x64d,&local_10b0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_10d8,plVar6,(char (*) [1])0x1de254);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_10e8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_970);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_10ec = 6;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_10d8,&local_10e8,0x64d,1,2,p_Var9,"std::get<1>(*it)",&local_10ec,"6");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_10d8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1100,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1110);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1100,0x64e,&local_1110);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1138,plVar6,(char (*) [1])0x1de254);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1148,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_970);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_114c = 0xc;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_1138,&local_1148,0x64e,1,2,p_Var10,"std::get<2>(*it)",&local_114c,"12");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1138);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_970);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1160,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1170);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1160,0x650,&local_1170);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1198,plVar6,(char (*) [1])0x1de254);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_11a8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_970);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_11ac = 1;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_1198,&local_11a8,0x650,1,2,p_Var8,"std::get<0>(*it)",&local_11ac,"1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1198);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_11c0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_11d0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_11c0,0x651,&local_11d0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_11f8,plVar6,(char (*) [1])0x1de254);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1208,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_970);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_120c = 0xb;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_11f8,&local_1208,0x651,1,2,p_Var9,"std::get<1>(*it)",&local_120c,"11");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_11f8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1220,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1230);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1220,0x652,&local_1230);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1258,plVar6,(char (*) [1])0x1de254);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1268,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_970);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_126c = 0xf;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_1258,&local_1268,0x652,1,2,p_Var10,"std::get<2>(*it)",&local_126c,"15");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1258);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_970);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1280,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1290);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1280,0x654,&local_1290);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_12b8,plVar6,(char (*) [1])0x1de254);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_12c8,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_970);
    p_Var8 = std::get<0ul,int,int,int>(ptVar7);
    local_12cc = 1;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_12b8,&local_12c8,0x654,1,2,p_Var8,"std::get<0>(*it)",&local_12cc,"1");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_12b8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_12e0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_12f0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_12e0,0x655,&local_12f0);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1318,plVar6,(char (*) [1])0x1de254);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1328,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_970);
    p_Var9 = std::get<1ul,int,int,int>(ptVar7);
    local_132c = 0xd;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_1318,&local_1328,0x655,1,2,p_Var9,"std::get<1>(*it)",&local_132c,"13");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1318);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1340,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1350);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1340,0x656,&local_1350);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<(&local_1378,plVar6,(char (*) [1])0x1de254);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1388,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    ptVar7 = std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator*(&local_970);
    p_Var10 = std::get<2ul,int,int,int>(ptVar7);
    local_138c = 0x10;
    boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
              (&local_1378,&local_1388,0x656,1,2,p_Var10,"std::get<2>(*it)",&local_138c,"16");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl(&local_1378);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::_Rb_tree_const_iterator<std::tuple<int,_int,_int>_>::operator++(&local_970);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_13a0,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_13b0);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_13a0,0x658,&local_13b0);
    local_13d0._M_node =
         (_Base_ptr)
         std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::
         end((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar2 = std::operator==(&local_970,&local_13d0);
    boost::test_tools::assertion_result::assertion_result(&local_13c8,bVar2);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1400,"it == bars1.end()",0x11);
    boost::unit_test::operator<<(&local_13f0,plVar6,&local_1400);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1410,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_13c8,&local_13f0,&local_1410,0x658,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_13f0);
    boost::test_tools::assertion_result::~assertion_result(&local_13c8);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1420,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_1430);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1420,0x65a,&local_1430);
    bVar2 = std::operator==((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
                             *)&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
                             *)&bars3._M_t._M_impl.super__Rb_tree_header._M_node_count);
    boost::test_tools::assertion_result::assertion_result(&local_1448,bVar2);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1478,"bars1 == bars2",0xe);
    boost::unit_test::operator<<(&local_1468,plVar6,&local_1478);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1488,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_1448,&local_1468,&local_1488,0x65a,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_1468);
    boost::test_tools::assertion_result::~assertion_result(&local_1448);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1498,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(&local_14a8);
    boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_1498,0x65b,&local_14a8);
    bVar2 = std::operator==((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
                             *)&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            (set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>
                             *)&it_1);
    boost::test_tools::assertion_result::assertion_result(&local_14c0,bVar2);
    plVar6 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_14f0,"bars1 == bars3",0xe);
    boost::unit_test::operator<<(&local_14e0,plVar6,&local_14f0);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1500,
               "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
               ,0x73);
    boost::test_tools::tt_detail::report_assertion(&local_14c0,&local_14e0,&local_1500,0x65b,1,0,0);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl(&local_14e0);
    boost::test_tools::assertion_result::~assertion_result(&local_14c0);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::~set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&it_1);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::~set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars3._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_>::~set
            ((set<std::tuple<int,_int,_int>,_BarComp,_std::allocator<std::tuple<int,_int,_int>_>_> *
             )&bars2._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)local_4b8);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>
  ::~Matrix((Matrix<Chain_vine_options<(Gudhi::persistence_matrix::Column_types)7,_false,_true,_true,_false,_true>_>
             *)local_180);
  return;
}

Assistant:

void test_shifted_barcode1() {
  using C = typename Matrix::Column;
  struct BarComp {
    bool operator()(const std::tuple<int, int, int>& c1, const std::tuple<int, int, int>& c2) const {
      if (std::get<0>(c1) != std::get<0>(c2)) return std::get<0>(c1) < std::get<0>(c2);
      if (std::get<1>(c1) != std::get<1>(c2)) return std::get<1>(c1) < std::get<1>(c2);
      return std::get<2>(c1) < std::get<2>(c2);
    }
  };

  Matrix m(17, 2);
  if constexpr (is_z2<C>()) {
    m.insert_boundary(0, {}, 0);
    m.insert_boundary(1, {}, 0);
    m.insert_boundary(2, {}, 0);
    m.insert_boundary(3, {}, 0);
    m.insert_boundary(4, {}, 0);
    m.insert_boundary(5, {}, 0);
    m.insert_boundary(6, {}, 0);
    m.insert_boundary(10, {0, 1}, 1);
    m.insert_boundary(11, {1, 3}, 1);
    m.insert_boundary(12, {2, 3}, 1);
    m.insert_boundary(13, {2, 4}, 1);
    m.insert_boundary(14, {3, 4}, 1);
    m.insert_boundary(15, {2, 6}, 1);
    m.insert_boundary(16, {4, 6}, 1);
    m.insert_boundary(17, {5, 6}, 1);
    m.insert_boundary(30, {12, 13, 14}, 2);
    m.insert_boundary(31, {13, 15, 16}, 2);
  } else {
    m.insert_boundary(0, {}, 0);
    m.insert_boundary(1, {}, 0);
    m.insert_boundary(2, {}, 0);
    m.insert_boundary(3, {}, 0);
    m.insert_boundary(4, {}, 0);
    m.insert_boundary(5, {}, 0);
    m.insert_boundary(6, {}, 0);
    m.insert_boundary(10, {{0, 1}, {1, 1}}, 1);
    m.insert_boundary(11, {{1, 1}, {3, 1}}, 1);
    m.insert_boundary(12, {{2, 1}, {3, 1}}, 1);
    m.insert_boundary(13, {{2, 1}, {4, 1}}, 1);
    m.insert_boundary(14, {{3, 1}, {4, 1}}, 1);
    m.insert_boundary(15, {{2, 1}, {6, 1}}, 1);
    m.insert_boundary(16, {{4, 1}, {6, 1}}, 1);
    m.insert_boundary(17, {{5, 1}, {6, 1}}, 1);
    m.insert_boundary(30, {{12, 1}, {13, 1}, {14, 1}}, 2);
    m.insert_boundary(31, {{13, 1}, {15, 1}, {16, 1}}, 2);
  }

  const auto& barcode = m.get_current_barcode();

  std::vector<witness_content<C> > reducedMatrix;
  if constexpr (is_z2<C>()) {
    if constexpr (Matrix::Option_list::is_of_boundary_type) {
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({0, 1});
      reducedMatrix.push_back({1, 3});
      reducedMatrix.push_back({1, 2});
      reducedMatrix.push_back({2, 4});
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({2, 6});
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({2, 5});
      reducedMatrix.push_back({12, 13, 14});
      reducedMatrix.push_back({13, 15, 16});
    } else {
      reducedMatrix.push_back({0});
      reducedMatrix.push_back({0, 1});
      reducedMatrix.push_back({0, 2});
      reducedMatrix.push_back({0, 3});
      reducedMatrix.push_back({0, 4});
      reducedMatrix.push_back({0, 5});
      reducedMatrix.push_back({0, 6});
      reducedMatrix.push_back({10});
      reducedMatrix.push_back({10, 11});
      reducedMatrix.push_back({10, 11, 12});
      reducedMatrix.push_back({10, 11, 12, 13});
      reducedMatrix.push_back({12, 13, 14});
      reducedMatrix.push_back({10, 11, 12, 15});
      reducedMatrix.push_back({13, 15, 16});
      reducedMatrix.push_back({10, 11, 12, 15, 17});
      reducedMatrix.push_back({30});
      reducedMatrix.push_back({31});
    }
  } else {
    if constexpr (Matrix::Option_list::is_of_boundary_type) {
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({{0, 1}, {1, 1}});
      reducedMatrix.push_back({{1, 1}, {3, 1}});
      reducedMatrix.push_back({{1, 1}, {2, 1}});
      reducedMatrix.push_back({{2, 1}, {4, 1}});
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({{2, 1}, {6, 1}});
      reducedMatrix.emplace_back();
      reducedMatrix.push_back({{2, 1}, {5, 1}});
      reducedMatrix.push_back({{12, 1}, {13, 1}, {14, 1}});
      reducedMatrix.push_back({{13, 1}, {15, 1}, {16, 1}});
    } else {
      reducedMatrix.push_back({{0, 1}});
      reducedMatrix.push_back({{0, 1}, {1, 1}});
      reducedMatrix.push_back({{0, 1}, {2, 1}});
      reducedMatrix.push_back({{0, 1}, {3, 1}});
      reducedMatrix.push_back({{0, 1}, {4, 1}});
      reducedMatrix.push_back({{0, 1}, {5, 1}});
      reducedMatrix.push_back({{0, 1}, {6, 1}});
      reducedMatrix.push_back({{10, 1}});
      reducedMatrix.push_back({{10, 1}, {11, 1}});
      reducedMatrix.push_back({{10, 1}, {11, 1}, {12, 1}});
      reducedMatrix.push_back({{10, 1}, {11, 1}, {12, 1}, {13, 1}});
      reducedMatrix.push_back({{12, 1}, {13, 1}, {14, 1}});
      reducedMatrix.push_back({{10, 1}, {11, 1}, {12, 1}, {15, 1}});
      reducedMatrix.push_back({{13, 1}, {15, 1}, {16, 1}});
      reducedMatrix.push_back({{10, 1}, {11, 1}, {12, 1}, {15, 1}, {17, 1}});
      reducedMatrix.push_back({{30, 1}});
      reducedMatrix.push_back({{31, 1}});
    }
  }

  if constexpr (Matrix::Option_list::column_indexation_type == Column_indexation_types::IDENTIFIER) {
    test_column_equality<C>(reducedMatrix[0], get_column_content_via_iterators(m.get_column(0)));
    test_column_equality<C>(reducedMatrix[1], get_column_content_via_iterators(m.get_column(1)));
    test_column_equality<C>(reducedMatrix[2], get_column_content_via_iterators(m.get_column(2)));
    test_column_equality<C>(reducedMatrix[3], get_column_content_via_iterators(m.get_column(3)));
    test_column_equality<C>(reducedMatrix[4], get_column_content_via_iterators(m.get_column(4)));
    test_column_equality<C>(reducedMatrix[5], get_column_content_via_iterators(m.get_column(5)));
    test_column_equality<C>(reducedMatrix[6], get_column_content_via_iterators(m.get_column(6)));
    test_column_equality<C>(reducedMatrix[7], get_column_content_via_iterators(m.get_column(10)));
    test_column_equality<C>(reducedMatrix[8], get_column_content_via_iterators(m.get_column(11)));
    test_column_equality<C>(reducedMatrix[9], get_column_content_via_iterators(m.get_column(12)));
    test_column_equality<C>(reducedMatrix[10], get_column_content_via_iterators(m.get_column(13)));
    test_column_equality<C>(reducedMatrix[11], get_column_content_via_iterators(m.get_column(14)));
    test_column_equality<C>(reducedMatrix[12], get_column_content_via_iterators(m.get_column(15)));
    test_column_equality<C>(reducedMatrix[13], get_column_content_via_iterators(m.get_column(16)));
    test_column_equality<C>(reducedMatrix[14], get_column_content_via_iterators(m.get_column(17)));
    test_column_equality<C>(reducedMatrix[15], get_column_content_via_iterators(m.get_column(30)));
    test_column_equality<C>(reducedMatrix[16], get_column_content_via_iterators(m.get_column(31)));
  } else {
    test_content_equality(reducedMatrix, m);
  }

  std::set<std::tuple<int, int, int>, BarComp> bars1;
  std::set<std::tuple<int, int, int>, BarComp> bars2;
  std::set<std::tuple<int, int, int>, BarComp> bars3;
  // bars are not ordered the same for all matrices
  for (auto it = barcode.begin(); it != barcode.end(); ++it) {
    // three access possibilities
    bars1.emplace(it->dim, it->birth, it->death);
    bars2.emplace(std::get<2>(*it), std::get<0>(*it), std::get<1>(*it));
    auto [x, y, z] = *it;
    bars3.emplace(z, x, y);
  }
  auto it = bars1.begin();
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<2>(*it), -1);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 7);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 2);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 9);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 3);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 8);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 4);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 10);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 5);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 14);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 0);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 6);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 12);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 11);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 15);
  ++it;
  BOOST_CHECK_EQUAL(std::get<0>(*it), 1);
  BOOST_CHECK_EQUAL(std::get<1>(*it), 13);
  BOOST_CHECK_EQUAL(std::get<2>(*it), 16);
  ++it;
  BOOST_CHECK(it == bars1.end());

  BOOST_CHECK(bars1 == bars2);
  BOOST_CHECK(bars1 == bars3);
}